

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O3

cbtBroadphaseProxy * __thiscall
cbtSimpleBroadphase::createProxy
          (cbtSimpleBroadphase *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int shapeType,
          void *userPtr,int collisionFilterGroup,int collisionFilterMask,cbtDispatcher *param_7)

{
  int iVar1;
  cbtSimpleBroadphaseProxy *pcVar2;
  undefined8 uVar3;
  cbtBroadphaseProxy *pcVar4;
  
  if (this->m_numHandles < this->m_maxHandles) {
    iVar1 = this->m_firstFreeHandle;
    pcVar2 = this->m_pHandles;
    this->m_firstFreeHandle = *(int *)&pcVar2[iVar1].super_cbtBroadphaseProxy.field_0x34;
    this->m_numHandles = this->m_numHandles + 1;
    if (this->m_LastHandleIndex < iVar1) {
      this->m_LastHandleIndex = iVar1;
    }
    pcVar2[iVar1].super_cbtBroadphaseProxy.m_clientObject = userPtr;
    pcVar2[iVar1].super_cbtBroadphaseProxy.m_collisionFilterGroup = collisionFilterGroup;
    pcVar2[iVar1].super_cbtBroadphaseProxy.m_collisionFilterMask = collisionFilterMask;
    pcVar4 = &pcVar2[iVar1].super_cbtBroadphaseProxy;
    uVar3 = *(undefined8 *)(aabbMin->m_floats + 2);
    *(undefined8 *)pcVar2[iVar1].super_cbtBroadphaseProxy.m_aabbMin.m_floats =
         *(undefined8 *)aabbMin->m_floats;
    *(undefined8 *)(pcVar2[iVar1].super_cbtBroadphaseProxy.m_aabbMin.m_floats + 2) = uVar3;
    uVar3 = *(undefined8 *)(aabbMax->m_floats + 2);
    *(undefined8 *)pcVar2[iVar1].super_cbtBroadphaseProxy.m_aabbMax.m_floats =
         *(undefined8 *)aabbMax->m_floats;
    *(undefined8 *)(pcVar2[iVar1].super_cbtBroadphaseProxy.m_aabbMax.m_floats + 2) = uVar3;
  }
  else {
    pcVar4 = (cbtBroadphaseProxy *)0x0;
  }
  return pcVar4;
}

Assistant:

cbtBroadphaseProxy* cbtSimpleBroadphase::createProxy(const cbtVector3& aabbMin, const cbtVector3& aabbMax, int shapeType, void* userPtr, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* /*dispatcher*/)
{
	if (m_numHandles >= m_maxHandles)
	{
		cbtAssert(0);
		return 0;  //should never happen, but don't let the game crash ;-)
	}
	cbtAssert(aabbMin[0] <= aabbMax[0] && aabbMin[1] <= aabbMax[1] && aabbMin[2] <= aabbMax[2]);

	int newHandleIndex = allocHandle();
	cbtSimpleBroadphaseProxy* proxy = new (&m_pHandles[newHandleIndex]) cbtSimpleBroadphaseProxy(aabbMin, aabbMax, shapeType, userPtr, collisionFilterGroup, collisionFilterMask);

	return proxy;
}